

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void reset_nonplayer_visible_characters(tgestate_t *state)

{
  char cVar1;
  vischar_t *vischar;
  
  vischar = state->vischars;
  cVar1 = -7;
  do {
    vischar = vischar + 1;
    reset_visible_character(state,vischar);
    cVar1 = cVar1 + '\x01';
  } while (cVar1 != '\0');
  return;
}

Assistant:

void reset_nonplayer_visible_characters(tgestate_t *state)
{
  vischar_t *vischar; /* was HL */
  uint8_t    iters;   /* was B */

  assert(state != NULL);

  vischar = &state->vischars[1];
  iters = vischars_LENGTH - 1;
  do
    reset_visible_character(state, vischar++);
  while (--iters);
}